

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void columnMallocFailure(sqlite3_stmt *pStmt)

{
  int iVar1;
  Vdbe *p;
  sqlite3_stmt *pStmt_local;
  
  if (pStmt != (sqlite3_stmt *)0x0) {
    iVar1 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x38));
    *(int *)(pStmt + 0x38) = iVar1;
    sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return;
}

Assistant:

static void columnMallocFailure(sqlite3_stmt *pStmt)
{
  /* If malloc() failed during an encoding conversion within an
  ** sqlite3_column_XXX API, then set the return code of the statement to
  ** SQLITE_NOMEM. The next call to _step() (if any) will return SQLITE_ERROR
  ** and _finalize() will return NOMEM.
  */
  Vdbe *p = (Vdbe *)pStmt;
  if( p ){
    assert( p->db!=0 );
    assert( sqlite3_mutex_held(p->db->mutex) );
    p->rc = sqlite3ApiExit(p->db, p->rc);
    sqlite3_mutex_leave(p->db->mutex);
  }
}